

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Packer.h
# Opt level: O0

Ptr<axl::mem::Block> __thiscall axl::sl::Packer::createPackage_va(Packer *this,axl_va_list *va)

{
  Box<axl::mem::Block> *pBVar1;
  Box<axl::mem::Block> *pBVar2;
  RefCount *extraout_RDX;
  RefCount *extraout_RDX_00;
  RefCount *pRVar3;
  undefined8 *in_RSI;
  Block *in_RDI;
  Ptr<axl::mem::Block> PVar4;
  Ptr<axl::rc::Box<axl::mem::Block>_> package;
  size_t size;
  Box<axl::mem::Block> *in_stack_fffffffffffffec8;
  Box<axl::mem::Block> *in_stack_fffffffffffffed0;
  size_t sVar5;
  Box<axl::mem::Block> *in_stack_fffffffffffffee0;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  Ptr<axl::rc::Box<axl::mem::Block>_> local_80 [2];
  undefined1 local_60 [32];
  undefined1 local_40 [32];
  size_t local_20 [4];
  
  local_20[0] = 0;
  axl_va_list::axl_va_list
            ((axl_va_list *)in_stack_fffffffffffffed0,(axl_va_list *)in_stack_fffffffffffffec8);
  (**(code **)*in_RSI)(local_40,in_RSI,0,local_20,local_60);
  axl_va_list::~axl_va_list((axl_va_list *)0x123f29);
  axl_va_list::~axl_va_list((axl_va_list *)0x123f36);
  if (local_20[0] == 0xffffffffffffffff) {
    rc::Ptr<axl::mem::Block>::Ptr
              ((Ptr<axl::mem::Block> *)in_stack_fffffffffffffed0,
               (NullPtr *)in_stack_fffffffffffffec8);
    pRVar3 = extraout_RDX;
  }
  else {
    mem::allocate(0x123f8e);
    rc::Box<axl::mem::Block>::Box(in_stack_fffffffffffffee0);
    rc::primeRefCount<axl::rc::Box<axl::mem::Block>>
              (in_stack_fffffffffffffed0,(FreeFunc *)in_stack_fffffffffffffec8);
    rc::Ptr<axl::rc::Box<axl::mem::Block>>::Ptr<axl::rc::Box<axl::mem::Block>>
              ((Ptr<axl::rc::Box<axl::mem::Block>_> *)in_stack_fffffffffffffed0,
               in_stack_fffffffffffffec8);
    pBVar1 = rc::Ptr::operator_cast_to_Box_((Ptr *)local_80);
    axl_va_list::axl_va_list
              ((axl_va_list *)in_stack_fffffffffffffed0,(axl_va_list *)in_stack_fffffffffffffec8);
    (**(code **)*in_RSI)(local_a0,in_RSI,pBVar1 + 1,local_20,local_c0);
    axl_va_list::~axl_va_list((axl_va_list *)0x124027);
    axl_va_list::~axl_va_list((axl_va_list *)0x124031);
    pBVar1 = rc::Ptr::operator_cast_to_Box_((Ptr *)local_80);
    pBVar1 = pBVar1 + 1;
    pBVar2 = rc::Ptr<axl::rc::Box<axl::mem::Block>_>::operator->(local_80);
    (pBVar2->super_Block).m_p = pBVar1;
    sVar5 = local_20[0];
    pBVar2 = rc::Ptr<axl::rc::Box<axl::mem::Block>_>::operator->(local_80);
    (pBVar2->super_Block).m_size = sVar5;
    rc::Ptr<axl::mem::Block>::Ptr<axl::rc::Box<axl::mem::Block>>
              ((Ptr<axl::mem::Block> *)pBVar1,(Ptr<axl::rc::Box<axl::mem::Block>_> *)pBVar2);
    rc::Ptr<axl::rc::Box<axl::mem::Block>_>::~Ptr((Ptr<axl::rc::Box<axl::mem::Block>_> *)0x1240c5);
    pRVar3 = extraout_RDX_00;
  }
  PVar4.m_refCount = pRVar3;
  PVar4.m_p = in_RDI;
  return PVar4;
}

Assistant:

rc::Ptr<mem::Block>
	createPackage_va(axl_va_list va) {
		size_t size = 0;
		pack_va(NULL, &size, va);

		if (size == -1)
			return rc::g_nullPtr;

		typedef rc::Box<mem::Block> Package;
		rc::Ptr<Package> package = AXL_RC_NEW_EXTRA(Package, size);
		pack_va(package + 1, &size, va);
		package->m_p = package + 1;
		package->m_size = size;

		return package;
	}